

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O0

void __thiscall
llm_tokenizer_ugm_session::tokenize
          (llm_tokenizer_ugm_session *this,string *text,vector<int,_std::allocator<int>_> *output)

{
  bool bVar1;
  undefined4 uVar2;
  bool bVar3;
  llama_token lVar4;
  llama_token lVar5;
  reference pvVar6;
  unsigned_long *puVar7;
  token_data *ptVar8;
  reference pvVar9;
  vector<int,_std::allocator<int>_> *in_RDX;
  long in_RDI;
  byte bVar10;
  float fVar11;
  bool is_unknown;
  best_tokenization *tokenization;
  bool is_prev_unknown;
  best_tokenization challenger_1;
  best_tokenization *current_champ_1;
  double challenger_score_1;
  best_tokenization challenger;
  best_tokenization *current_champ;
  double challenger_score;
  double token_score;
  token_data *token_data;
  llama_token token_id;
  naive_trie *node;
  best_tokenization *current_best;
  bool single_codepoint_token_found;
  size_t n_utf8_code_units;
  size_t prefix_offset;
  size_t input_offset;
  vector<llm_tokenizer_ugm_session::best_tokenization,_std::allocator<llm_tokenizer_ugm_session::best_tokenization>_>
  tokenization_results;
  size_t input_len;
  string normalized;
  size_t output_size;
  undefined4 in_stack_fffffffffffffde8;
  llama_token in_stack_fffffffffffffdec;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffdf8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffe00;
  naive_trie *in_stack_fffffffffffffe08;
  vector<llm_tokenizer_ugm_session::best_tokenization,_std::allocator<llm_tokenizer_ugm_session::best_tokenization>_>
  *in_stack_fffffffffffffe10;
  string *this_00;
  string *in_stack_fffffffffffffe80;
  string *in_stack_fffffffffffffe88;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  byte local_159;
  undefined4 uStack_154;
  undefined4 uStack_144;
  undefined4 uStack_12c;
  undefined4 uStack_11c;
  naive_trie *local_f0;
  unsigned_long local_d8;
  size_t local_d0;
  unsigned_long local_c8;
  ulong local_c0;
  ulong local_b8;
  llama_token local_b0;
  undefined4 uStack_ac;
  size_t local_a8;
  undefined8 local_a0;
  llama_token local_90;
  undefined8 local_88;
  undefined4 local_80;
  vector<llm_tokenizer_ugm_session::best_tokenization,_std::allocator<llm_tokenizer_ugm_session::best_tokenization>_>
  local_78;
  undefined4 local_5c;
  ulong local_58;
  string local_40 [32];
  size_type local_20;
  
  local_20 = std::vector<int,_std::allocator<int>_>::size(in_RDX);
  this_00 = local_40;
  std::__cxx11::string::string(this_00);
  normalize((llm_tokenizer_ugm_session *)
            CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),in_stack_fffffffffffffe88,
            in_stack_fffffffffffffe80);
  local_58 = std::__cxx11::string::size();
  if (local_58 == 0) {
    local_5c = 1;
  }
  else {
    local_90 = llama_vocab::token_unk((llama_vocab *)0x5413c1);
    local_88 = 0;
    local_80 = 0xff7fffff;
    llama_vocab::std::allocator<llm_tokenizer_ugm_session::best_tokenization>::allocator
              ((allocator<llm_tokenizer_ugm_session::best_tokenization> *)0x5413f1);
    llama_vocab::std::
    vector<llm_tokenizer_ugm_session::best_tokenization,_std::allocator<llm_tokenizer_ugm_session::best_tokenization>_>
    ::vector(in_stack_fffffffffffffe10,(size_type)in_stack_fffffffffffffe08,
             (value_type *)in_stack_fffffffffffffe00._M_current,
             (allocator_type *)in_stack_fffffffffffffdf8._M_current);
    llama_vocab::std::allocator<llm_tokenizer_ugm_session::best_tokenization>::~allocator
              ((allocator<llm_tokenizer_ugm_session::best_tokenization> *)0x54141f);
    memset(&local_b0,0,0x18);
    local_b0 = llama_vocab::token_unk((llama_vocab *)0x541443);
    pvVar6 = llama_vocab::std::
             vector<llm_tokenizer_ugm_session::best_tokenization,_std::allocator<llm_tokenizer_ugm_session::best_tokenization>_>
             ::operator[](&local_78,0);
    *(ulong *)pvVar6 = CONCAT44(uStack_ac,local_b0);
    pvVar6->input_offset = local_a8;
    *(undefined8 *)&pvVar6->score_sum = local_a0;
    for (local_b8 = 0; local_b8 < local_58; local_b8 = local_c8 + local_b8) {
      local_c0 = local_b8;
      std::__cxx11::string::operator[]((ulong)local_40);
      local_d0 = unicode_len_utf8((char)((ulong)this_00 >> 0x38));
      local_d8 = local_58 - local_b8;
      puVar7 = std::min<unsigned_long>(&local_d0,&local_d8);
      local_c8 = *puVar7;
      bVar1 = false;
      pvVar6 = llama_vocab::std::
               vector<llm_tokenizer_ugm_session::best_tokenization,_std::allocator<llm_tokenizer_ugm_session::best_tokenization>_>
               ::operator[](&local_78,local_b8);
      local_c0 = local_c0 + 1;
      std::__cxx11::string::operator[]((ulong)local_40);
      local_f0 = naive_trie::traverse
                           (in_stack_fffffffffffffe08,
                            (char)((ulong)in_stack_fffffffffffffe00._M_current >> 0x38));
      while (local_c0 <= local_58 && local_f0 != (naive_trie *)0x0) {
        if ((local_f0->has_value & 1U) != 0) {
          if (local_c0 - local_b8 == local_c8) {
            bVar1 = true;
          }
          lVar4 = local_f0->value;
          ptVar8 = llama_vocab::get_token_data
                             ((llama_vocab *)
                              CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                              in_stack_fffffffffffffdec);
          bVar3 = llama_vocab::is_user_defined
                            ((llama_vocab *)
                             CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                             in_stack_fffffffffffffdec);
          if (bVar3) {
            fVar11 = 0.0;
          }
          else {
            fVar11 = ptVar8->score;
          }
          fVar11 = pvVar6->score_sum + fVar11;
          pvVar9 = llama_vocab::std::
                   vector<llm_tokenizer_ugm_session::best_tokenization,_std::allocator<llm_tokenizer_ugm_session::best_tokenization>_>
                   ::operator[](&local_78,local_c0);
          if (pvVar9->score_sum < fVar11) {
            *(ulong *)pvVar9 = CONCAT44(uStack_12c,lVar4);
            pvVar9->input_offset = local_b8;
            *(ulong *)&pvVar9->score_sum = CONCAT44(uStack_11c,fVar11);
          }
        }
        local_c0 = local_c0 + 1;
        in_stack_fffffffffffffe08 = (naive_trie *)std::__cxx11::string::operator[]((ulong)local_40);
        in_stack_fffffffffffffdf8._M_current =
             (int *)naive_trie::traverse(in_stack_fffffffffffffe08,(char)((ulong)local_f0 >> 0x38));
        in_stack_fffffffffffffe00._M_current = (int *)local_f0;
        local_f0 = (naive_trie *)in_stack_fffffffffffffdf8._M_current;
      }
      if (!bVar1) {
        fVar11 = pvVar6->score_sum + *(float *)(*(long *)(in_RDI + 8) + 0x8c);
        local_c0 = local_b8 + local_c8;
        pvVar6 = llama_vocab::std::
                 vector<llm_tokenizer_ugm_session::best_tokenization,_std::allocator<llm_tokenizer_ugm_session::best_tokenization>_>
                 ::operator[](&local_78,local_c0);
        if (pvVar6->score_sum < fVar11) {
          lVar4 = llama_vocab::token_unk((llama_vocab *)0x5418c7);
          *(ulong *)pvVar6 = CONCAT44(uStack_154,lVar4);
          pvVar6->input_offset = local_b8;
          *(ulong *)&pvVar6->score_sum = CONCAT44(uStack_144,fVar11);
        }
      }
    }
    local_159 = 0;
    pvVar6 = llama_vocab::std::
             vector<llm_tokenizer_ugm_session::best_tokenization,_std::allocator<llm_tokenizer_ugm_session::best_tokenization>_>
             ::operator[](&local_78,local_58);
    while( true ) {
      lVar4 = pvVar6->token_id;
      lVar5 = llama_vocab::token_unk((llama_vocab *)0x541981);
      bVar10 = lVar4 == lVar5;
      if ((local_159 == 0) || (!(bool)bVar10)) {
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe00._M_current,
                   in_stack_fffffffffffffdf8._M_current);
      }
      if (pvVar6->input_offset == 0) break;
      local_159 = bVar10 & 1;
      pvVar9 = llama_vocab::std::
               vector<llm_tokenizer_ugm_session::best_tokenization,_std::allocator<llm_tokenizer_ugm_session::best_tokenization>_>
               ::operator[](&local_78,pvVar6->input_offset);
      uVar2 = *(undefined4 *)&pvVar9->field_0x4;
      pvVar6->token_id = pvVar9->token_id;
      *(undefined4 *)&pvVar6->field_0x4 = uVar2;
      pvVar6->input_offset = pvVar9->input_offset;
      uVar2 = *(undefined4 *)&pvVar9->field_0x14;
      pvVar6->score_sum = pvVar9->score_sum;
      *(undefined4 *)&pvVar6->field_0x14 = uVar2;
    }
    std::vector<int,_std::allocator<int>_>::begin
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
               in_stack_fffffffffffffdf8._M_current,CONCAT44(lVar4,in_stack_fffffffffffffdf0));
    std::vector<int,_std::allocator<int>_>::end
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
    std::reverse<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    llama_vocab::std::
    vector<llm_tokenizer_ugm_session::best_tokenization,_std::allocator<llm_tokenizer_ugm_session::best_tokenization>_>
    ::~vector((vector<llm_tokenizer_ugm_session::best_tokenization,_std::allocator<llm_tokenizer_ugm_session::best_tokenization>_>
               *)in_stack_fffffffffffffe00._M_current);
    local_5c = 0;
  }
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void tokenize(const std::string & text, std::vector<llama_token> & output) {
        // get current size of output (for reversal later)
        size_t output_size = output.size();

        // normalize the input first
        std::string normalized;
        normalize(text, &normalized);
        size_t input_len = normalized.size();
        if (input_len == 0) {
            return;
        }

        // initialize score_sum to -FLT_MAX so it will be always lower than sums of token scores
        std::vector<struct best_tokenization> tokenization_results(input_len + 1, {vocab.token_unk(), 0, -FLT_MAX});
        // at the beginning tokenization score is zero
        tokenization_results[0] = { vocab.token_unk(), 0, 0 };

        for (size_t input_offset = 0; input_offset < input_len;) {
            size_t prefix_offset = input_offset;
            // calculate how many code units are in the currently processed UTF code point
            size_t n_utf8_code_units = std::min<size_t>(unicode_len_utf8(normalized[input_offset]), input_len - input_offset);

            // traverse the token matcher trie to find a matching token
            bool single_codepoint_token_found = false;
            const struct best_tokenization & current_best = tokenization_results[input_offset];
            const struct naive_trie * node = tokenizer.token_matcher.traverse(normalized[prefix_offset++]);

            while (prefix_offset <= input_len && node != NULL) {
                // check if we found valid token in prefix
                if (node->has_value) {
                    // check if it corresponds to the whole UTF code point
                    if (prefix_offset - input_offset == n_utf8_code_units) {
                        single_codepoint_token_found = true;
                    }
                    llama_token token_id = node->value;
                    const auto & token_data = vocab.get_token_data(token_id);

                    // we set the user-defined token scores to 0 to make them more likely to be selected
                    // (normal token scores are log probabilities, so they are negative)
                    // score type is double here to make tokenization results exactly
                    // the same as in the HF tokenizer using SentencePiece
                    const double token_score = vocab.is_user_defined(token_id) ? 0.0 : token_data.score;
                    const double challenger_score = current_best.score_sum + token_score;
                    struct best_tokenization & current_champ = tokenization_results[prefix_offset];
                    if (challenger_score > current_champ.score_sum) {
                        struct best_tokenization challenger = { token_id, input_offset, (float) challenger_score };
                        current_champ = challenger;
                    }
                }
                node = node->traverse(normalized[prefix_offset++]);
            }

            // if we didn't find a valid token corresponding to the whole UTF code point
            // then use unknown token as the tokenization of this UTF code point
            if (!single_codepoint_token_found) {
                const double challenger_score = current_best.score_sum + tokenizer.unknown_token_score;
                prefix_offset = input_offset + n_utf8_code_units;
                struct best_tokenization & current_champ = tokenization_results[prefix_offset];
                if (challenger_score > current_champ.score_sum) {
                    struct best_tokenization challenger = { vocab.token_unk(), input_offset, (float) challenger_score };
                    current_champ = challenger;
                }
            }

            // move to the next UTF code point
            input_offset += n_utf8_code_units;
        }

        // now backtrack from the end to gather token ids of the best tokenization
        // merge sequences of consecutive unknown tokens into single unknown tokens
        bool is_prev_unknown = false;
        for (struct best_tokenization & tokenization = tokenization_results[input_len]; ; tokenization = tokenization_results[tokenization.input_offset]) {
            bool is_unknown = tokenization.token_id == vocab.token_unk();
            if (!(is_prev_unknown && is_unknown)) {
                output.push_back(tokenization.token_id);
            }
            if (tokenization.input_offset == 0) {
                break;
            }
            is_prev_unknown = is_unknown;
        }

        // reverse the output since we added tokens starting from the end of the input
        std::reverse(output.begin() + output_size, output.end());
    }